

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void burgalg(double *x,int N,int p,double *phi,double *var)

{
  size_t __n;
  double dVar1;
  double dVar2;
  double *__dest;
  void *__dest_00;
  double *__s;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  
  __dest = (double *)malloc((long)N << 3);
  __dest_00 = malloc((long)N << 3);
  __s = (double *)malloc((long)(int)(p + 1U) << 3);
  if (0 < N) {
    __n = (ulong)(uint)N * 8;
    memcpy(__dest_00,x,__n);
    memcpy(__dest,x,__n);
  }
  if (-1 < p) {
    memset(__s,0,(ulong)(p + 1U) << 3);
  }
  *__s = 1.0;
  dVar13 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar14 = __dest[uVar3];
      dVar13 = dVar13 + (dVar14 + dVar14) * dVar14;
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  if (0 < p) {
    uVar11 = N - 1;
    lVar4 = (long)(int)uVar11;
    dVar14 = *(double *)((long)__dest_00 + lVar4 * 8);
    dVar13 = dVar13 - (*__dest * *__dest + dVar14 * dVar14);
    uVar3 = 1;
    uVar7 = 0;
    pdVar8 = __s;
    pdVar5 = __dest;
    do {
      pdVar5 = pdVar5 + 1;
      dVar14 = -0.0;
      lVar9 = lVar4 - uVar7;
      if (lVar9 != 0 && (long)uVar7 <= lVar4) {
        dVar14 = 0.0;
        uVar10 = 0;
        do {
          dVar14 = dVar14 + pdVar5[uVar10] * *(double *)((long)__dest_00 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
        dVar14 = dVar14 * -2.0;
      }
      dVar14 = dVar14 / dVar13;
      uVar7 = uVar7 + 1;
      lVar6 = 1;
      pdVar12 = __s;
      do {
        dVar1 = *pdVar12;
        dVar2 = pdVar8[lVar6];
        *pdVar12 = dVar14 * dVar2 + dVar1;
        pdVar8[lVar6] = dVar1 * dVar14 + dVar2;
        lVar6 = lVar6 + -1;
        pdVar12 = pdVar12 + 1;
      } while (-lVar6 != uVar3 >> 1);
      if (0 < lVar9) {
        uVar10 = 0;
        do {
          dVar1 = pdVar5[uVar10];
          dVar2 = *(double *)((long)__dest_00 + uVar10 * 8);
          pdVar5[uVar10] = dVar14 * dVar2 + dVar1;
          *(double *)((long)__dest_00 + uVar10 * 8) = dVar1 * dVar14 + dVar2;
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      dVar14 = dVar13 * (1.0 - dVar14 * dVar14);
      dVar13 = *(double *)((long)__dest_00 + lVar9 * 8 + -8);
      dVar13 = (dVar14 - __dest[uVar7] * __dest[uVar7]) - dVar13 * dVar13;
      uVar11 = uVar11 - 1;
      pdVar8 = pdVar8 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar7 != (uint)p);
    *var = dVar14 / (double)((int)lVar9 * 2);
    if (0 < p) {
      uVar3 = 0;
      do {
        phi[uVar3] = -__s[uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while ((uint)p != uVar3);
    }
  }
  free(__dest);
  free(__dest_00);
  free(__s);
  return;
}

Assistant:

void burgalg(double *x, int N, int p, double *phi,double *var) {
	int i, j, N1, p1;
	double dk,u,temp1,temp2;
	double *fk, *bk, *an;

	/*
	This code is the C translation of Cedrick Collomb's C++ Implemnetation of Burg's Algorithm
	with some minor modifications
	A tutorial on linear prediction and the Burg method.
	http://www.emptyloop.com/technotes/
	*/

	N1 = N;
	N = N - 1;
	p1 = p + 1;
	fk = (double*)malloc(sizeof(double) * N1);
	bk = (double*)malloc(sizeof(double)* N1);
	an = (double*)malloc(sizeof(double)* p1);

	for (i = 0; i < N1; ++i) {
		fk[i] = bk[i] = x[i];
	}

	for (i = 0; i < p1; ++i) {
		an[i] = 0.0;
		//printf("%g ", an[i]);
	}

	an[0] = 1.0;

	dk = 0.0;

	for (i = 0; i < N1; ++i) {
		dk += ( 2.0 * fk[i] * fk[i]);
	}

	dk -= (fk[0] * fk[0] + bk[N] * bk[N]);

	for (i = 0; i < p; ++i) {
		u = 0.0;
		for (j = 0; j <= N - i - 1; ++j) {
			u += (fk[i + j + 1] * bk[j]);
		}

		u = -2.0 * u / dk;
		 
		for (j = 0; j <= (i + 1) / 2; ++j) {
			temp1 = an[j] + u * an[i + 1 - j];
			temp2 = an[i + 1 - j] + u * an[j];
			an[j] = temp1;
			an[i + 1 - j] = temp2;
		}

		for (j = 0; j <= N - i - 1; ++j) {
			temp1 = fk[i + j + 1] + u * bk[j];
			temp2 = bk[j] + u * fk[i + j + 1];
			fk[i + j + 1] = temp1;
			bk[j] = temp2;
		}
		*var = (1.0 - u*u) * dk;
		dk = *var - fk[i + 1] * fk[i + 1] - bk[N - i - 1] * bk[N - i - 1];
		*var = *var / (2 * (N - i));

	}

	for (i = 0; i < p; ++i) {
		phi[i] = -1.0 * an[i+1];
	}

	free(fk);
	free(bk);
	free(an);
}